

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaMultiGenerator::ExpandCFGIntDir
          (string *__return_storage_ptr__,cmGlobalNinjaMultiGenerator *this,string *str,
          string *config)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  iVar1 = (*(this->super_cmGlobalNinjaGenerator).super_cmGlobalCommonGenerator.
            super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x15])(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,(char *)CONCAT44(extraout_var,iVar1),&local_39);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,&local_38,config);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaMultiGenerator::ExpandCFGIntDir(
  const std::string& str, const std::string& config) const
{
  std::string result = str;
  cmSystemTools::ReplaceString(result, this->GetCMakeCFGIntDir(), config);
  return result;
}